

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

bool __thiscall
Jinx::Impl::Parser::CheckPropertyName
          (Parser *this,LibraryIPtr *library,SymbolListCItr currSym,size_t *symCount)

{
  pointer pcVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  Symbol *pSVar5;
  ulong uVar6;
  String name;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_70;
  LibraryIPtr *local_50;
  size_t *local_48;
  Symbol *local_40;
  Symbol *local_38;
  
  if ((((this->m_error == false) &&
       ((this->m_symbolList->
        super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
        super__Vector_impl_data._M_finish != currSym._M_current)) &&
      ((currSym._M_current)->type == NameValue)) &&
     (uVar4 = ((library->super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              )->m_maxPropertyParts, uVar4 != 0)) {
    local_40 = currSym._M_current + 1;
    local_50 = library;
    local_48 = symCount;
    local_38 = currSym._M_current;
    do {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar1 = (local_38->text)._M_dataplus._M_p;
      std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)
                          &local_70,pcVar1,pcVar1 + (local_38->text)._M_string_length);
      sVar3 = 1;
      if (1 < uVar4) {
        uVar6 = 1;
        pSVar5 = local_40;
        do {
          if (((this->m_error == false) &&
              (pSVar5 != (this->m_symbolList->
                         super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                         )._M_impl.super__Vector_impl_data._M_finish)) &&
             ((pSVar5->type != NewLine && ((pSVar5->text)._M_string_length != 0)))) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                      (&local_70," ");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
            _M_append(&local_70,(pSVar5->text)._M_dataplus._M_p,(pSVar5->text)._M_string_length);
            sVar3 = sVar3 + 1;
          }
          uVar6 = uVar6 + 1;
          pSVar5 = pSVar5 + 1;
        } while (uVar6 < uVar4);
      }
      bVar2 = Library::PropertyNameExists
                        ((local_50->
                         super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                         ,&local_70);
      if (bVar2) {
        if (local_48 != (size_t *)0x0) {
          *local_48 = sVar3;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          MemFree(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        return true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        MemFree(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return false;
}

Assistant:

inline_t bool Parser::CheckPropertyName(LibraryIPtr library, SymbolListCItr currSym, size_t * symCount) const
	{
		// Internal function called once we've established a library to check
		// Check up to the max number of parts

		// Initial error checks
		if (m_error || currSym == m_symbolList.end())
			return false;
		if (currSym->type != SymbolType::NameValue)
			return false;

		// Check for names starting with max property count
		auto maxParts = library->GetMaxPropertyParts();
		for (size_t s = maxParts; s > 0; --s)
		{
			auto curr = currSym;
			auto name = String(curr->text);
			size_t sc = 1;
			for (size_t i = 1; i < s; ++i)
			{
				++curr;
				if (!IsSymbolValid(curr) || curr->text.empty())
					continue;
				name += " ";
				name += curr->text;
				++sc;
			}
			bool exists = library->PropertyNameExists(name);
			if (exists)
			{
				if (symCount)
					*symCount = sc;
				return true;
			}
		}
		return false;
	}